

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar2;
  bool bVar3;
  char *pcVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  uint uVar6;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartArray(handler);
  if (bVar3) {
    SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
    if (*(int *)(this + 0x30) == 0) {
      if (*is->current_ == ']') {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        pcVar4 = (handler->stack_).stackTop_;
        pcVar4[-8] = '\0';
        pcVar4[-7] = '\0';
        pcVar4[-6] = '\0';
        pcVar4[-5] = '\0';
        pcVar4[-4] = '\0';
        pcVar4[-3] = '\0';
        pcVar4[-2] = '\x04';
        pcVar4[-1] = '\0';
        pcVar4[-0x10] = '\0';
        pcVar4[-0xf] = '\0';
        pcVar4[-0xe] = '\0';
        pcVar4[-0xd] = '\0';
        pcVar4[-0xc] = '\0';
        pcVar4[-0xb] = '\0';
        pcVar4[-10] = '\0';
        pcVar4[-9] = '\0';
      }
      else {
        uVar6 = 0;
        while (ParseValue<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                         (this,is,handler), *(int *)(this + 0x30) == 0) {
          SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          cVar1 = *is->current_;
          if (cVar1 != ',') {
            if (cVar1 == ']') {
              BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
              uVar6 = uVar6 + 1;
              pMVar2 = handler->allocator_;
              pcVar4 = (handler->stack_).stackTop_;
              pGVar5 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(pcVar4 + (ulong)uVar6 * -0x10);
              (handler->stack_).stackTop_ = (char *)pGVar5;
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)(pcVar4 + (ulong)uVar6 * -0x10 + -0x10),pGVar5,uVar6,pMVar2);
              return;
            }
            pcVar4 = is->current_ + (is->count_ - (long)is->buffer_);
            *(undefined4 *)(this + 0x30) = 7;
            goto LAB_0013ec53;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>(this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          uVar6 = uVar6 + 1;
          if (*is->current_ == ']') {
            pMVar2 = handler->allocator_;
            pcVar4 = (handler->stack_).stackTop_;
            pGVar5 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)(pcVar4 + (ulong)uVar6 * -0x10);
            (handler->stack_).stackTop_ = (char *)pGVar5;
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)(pcVar4 + (ulong)uVar6 * -0x10 + -0x10),pGVar5,uVar6,pMVar2);
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            return;
          }
        }
      }
    }
  }
  else {
    pcVar4 = is->current_ + (is->count_ - (long)is->buffer_);
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0013ec53:
    *(char **)(this + 0x38) = pcVar4;
  }
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }